

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O2

void Omega_h::expand_into<signed_char>
               (Read<signed_char> *a_data,LOs *a2b,Write<signed_char> *b_data,Int width)

{
  Alloc *pAVar1;
  uint uVar2;
  ulong uVar3;
  uint n;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  ScopedTimer omega_h_scoped_function_timer;
  allocator local_c9;
  type f;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,&local_c9);
  std::operator+(&local_50,&local_70,":");
  std::__cxx11::to_string(&local_90,0x6a);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,&local_50,
                 &local_90);
  begin_code("expand_into",(char *)f.a2b.write_.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  pAVar1 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar4 = pAVar1->size;
  }
  else {
    sVar4 = (ulong)pAVar1 >> 3;
  }
  n = (int)(sVar4 >> 2) - 1;
  pAVar1 = (a_data->write_).shared_alloc_.alloc;
  uVar5 = n * width;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = (uint)pAVar1->size;
    uVar3 = (ulong)uVar2;
    uVar6 = uVar5;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
    uVar2 = (uint)uVar3;
    uVar6 = uVar2;
  }
  if (uVar5 != uVar2) {
    printf("This error can happen when an array has been subsetted - check sync_array usage vs sync_subset_array:\n a_data.size= %d na= %d width= %d"
           ,uVar3,(ulong)n,(ulong)(uint)width);
    pAVar1 = (a_data->write_).shared_alloc_.alloc;
    uVar6 = uVar5;
  }
  if (((ulong)pAVar1 & 1) == 0) {
    uVar3 = (ulong)(uint)pAVar1->size;
  }
  else {
    uVar3 = (ulong)pAVar1 >> 3;
  }
  if (uVar6 != (uint)uVar3) {
    printf("ERROR: a_data.size= %d na= %d width= %d\n",uVar3,(ulong)n,(ulong)(uint)width);
    pAVar1 = (a_data->write_).shared_alloc_.alloc;
  }
  if (((ulong)pAVar1 & 1) == 0) {
    uVar5 = (uint)pAVar1->size;
  }
  else {
    uVar5 = (uint)((ulong)pAVar1 >> 3);
  }
  if (uVar6 == uVar5) {
    Write<int>::Write((Write<int> *)&f,&a2b->write_);
    f.width = width;
    Write<signed_char>::Write(&f.b_data,b_data);
    Write<signed_char>::Write(&f.a_data.write_,&a_data->write_);
    parallel_for<Omega_h::expand_into<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<int>,Omega_h::Write<signed_char>,int)::_lambda(int)_1_>
              (n,&f);
    expand_into<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<int>,Omega_h::Write<signed_char>,int)
    ::{lambda(int)#1}::~Write((_lambda_int__1_ *)&f);
    ScopedTimer::~ScopedTimer(&omega_h_scoped_function_timer);
    return;
  }
  fail("assertion %s failed at %s +%d\n","a_data.size() == na * width",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x6e);
}

Assistant:

void expand_into(Read<T> a_data, LOs a2b, Write<T> b_data, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto na = a2b.size() - 1;
  if(a_data.size() != na * width) printf("This error can happen when an array has been subsetted - check sync_array usage vs sync_subset_array:\n"
                                         " a_data.size= %d na= %d width= %d", a_data.size(), na, width);
  OMEGA_H_CHECK_PRINTF(a_data.size() == na * width, "a_data.size= %d na= %d width= %d", a_data.size(), na, width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    for (auto b = a2b[a]; b < a2b[a + 1]; ++b) {
      for (Int j = 0; j < width; ++j) {
        b_data[b * width + j] = a_data[a * width + j];
      }
    }
  };
  parallel_for(na, std::move(f));
}